

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamStandardIndex::SummarizeIndexFile(BamStandardIndex *this)

{
  bool bVar1;
  BamStandardIndex *in_RDI;
  BamStandardIndex *unaff_retaddr;
  int i;
  iterator summaryEnd;
  iterator summaryIter;
  int numReferences;
  int *in_stack_00000048;
  BamStandardIndex *in_stack_00000050;
  BaiReferenceSummary *in_stack_ffffffffffffffc8;
  __normal_iterator<BamTools::Internal::BaiReferenceSummary_*,_std::vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>_>
  local_18 [2];
  BamStandardIndex *numReferences_00;
  
  numReferences_00 = in_RDI;
  ReadNumReferences(in_stack_00000050,in_stack_00000048);
  ReserveForSummary(unaff_retaddr,(int *)numReferences_00);
  local_18[0]._M_current =
       (BaiReferenceSummary *)
       std::
       vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
       ::begin(in_stack_ffffffffffffffc8);
  std::
  vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
  ::end((vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
         *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<BamTools::Internal::BaiReferenceSummary_*,_std::vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>_>
                        *)in_RDI,
                       (__normal_iterator<BamTools::Internal::BaiReferenceSummary_*,_std::vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<BamTools::Internal::BaiReferenceSummary_*,_std::vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>_>
    ::operator*(local_18);
    SummarizeReference(in_RDI,in_stack_ffffffffffffffc8);
    __gnu_cxx::
    __normal_iterator<BamTools::Internal::BaiReferenceSummary_*,_std::vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>_>
    ::operator++(local_18);
  }
  return;
}

Assistant:

void BamStandardIndex::SummarizeIndexFile(void) {

    // load number of reference sequences
    int numReferences;
    ReadNumReferences(numReferences);

    // initialize file summary data
    ReserveForSummary(numReferences);

    // iterate over reference entries
    BaiFileSummary::iterator summaryIter = m_indexFileSummary.begin();
    BaiFileSummary::iterator summaryEnd  = m_indexFileSummary.end();
    for ( int i = 0; summaryIter != summaryEnd; ++summaryIter, ++i )
        SummarizeReference(*summaryIter);
}